

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocman.cpp
# Opt level: O0

ScenarioUpperBound * __thiscall
despot::Pocman::CreateScenarioUpperBound(Pocman *this,string *name,string *particle_bound_name)

{
  bool bVar1;
  ostream *poVar2;
  string *particle_bound_name_local;
  string *name_local;
  Pocman *this_local;
  
  bVar1 = std::operator==(name,"TRIVIAL");
  if (bVar1) {
    this_local = (Pocman *)operator_new(0x10);
    despot::TrivialParticleUpperBound::TrivialParticleUpperBound
              ((TrivialParticleUpperBound *)this_local,&this->super_DSPOMDP);
  }
  else {
    bVar1 = std::operator==(name,"APPROX");
    if (bVar1) {
      this_local = (Pocman *)operator_new(0x10);
      PocmanApproxScenarioUpperBound::PocmanApproxScenarioUpperBound
                ((PocmanApproxScenarioUpperBound *)this_local,this);
    }
    else {
      bVar1 = std::operator==(name,"SMART");
      if (!bVar1) {
        bVar1 = std::operator==(name,"DEFAULT");
        if (!bVar1) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"Unsupported base upper bound: ");
          poVar2 = std::operator<<(poVar2,(string *)name);
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          exit(1);
        }
      }
      this_local = (Pocman *)operator_new(0x10);
      PocmanSmartParticleUpperBound::PocmanSmartParticleUpperBound
                ((PocmanSmartParticleUpperBound *)this_local,this);
    }
  }
  return (ScenarioUpperBound *)this_local;
}

Assistant:

ScenarioUpperBound* Pocman::CreateScenarioUpperBound(string name,
	string particle_bound_name) const {
	if (name == "TRIVIAL") {
		return new TrivialParticleUpperBound(this);
	} else if (name == "APPROX") {
		return new PocmanApproxScenarioUpperBound(this);
	} else if (name == "SMART" || name == "DEFAULT") {
		return new PocmanSmartParticleUpperBound(this);
	} else {
		cerr << "Unsupported base upper bound: " << name << endl;
		exit(1);
		return NULL;
	}
}